

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O3

void highsReportLogOptions(HighsLogOptions *log_options_)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puts("\nHighs log options");
  pcVar1 = "   log_stream = Not NULL";
  if (log_options_->log_stream == (FILE *)0x0) {
    pcVar1 = "   log_stream = NULL";
  }
  puts(pcVar1);
  pcVar2 = "false";
  pcVar1 = "false";
  if ((ulong)*log_options_->output_flag != 0) {
    pcVar1 = "true";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,pcVar1,pcVar1 + ((ulong)*log_options_->output_flag ^ 5));
  printf("   output_flag = %s\n",local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((ulong)*log_options_->log_to_console != 0) {
    pcVar2 = "true";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,pcVar2,pcVar2 + ((ulong)*log_options_->log_to_console ^ 5));
  printf("   log_to_console = %s\n",local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  printf("   log_dev_level = %d\n\n",(ulong)(uint)*log_options_->log_dev_level);
  return;
}

Assistant:

void highsReportLogOptions(const HighsLogOptions& log_options_) {
  printf("\nHighs log options\n");
  if (log_options_.log_stream == NULL) {
    printf("   log_stream = NULL\n");
  } else {
    printf("   log_stream = Not NULL\n");
  }
  printf("   output_flag = %s\n",
         highsBoolToString(*log_options_.output_flag).c_str());
  printf("   log_to_console = %s\n",
         highsBoolToString(*log_options_.log_to_console).c_str());
  printf("   log_dev_level = %" HIGHSINT_FORMAT "\n\n",
         *log_options_.log_dev_level);
}